

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O0

void setup_blocked_signals(sigaction *signal_action,int flags)

{
  uint in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  if ((in_ESI & 1) != 0) {
    sigaddset((sigset_t *)(in_RDI + 1),10);
  }
  if ((in_ESI & 2) != 0) {
    sigaddset((sigset_t *)(in_RDI + 1),0xc);
  }
  sigprocmask(0,(sigset_t *)(in_RDI + 1),(sigset_t *)0x0);
  return;
}

Assistant:

void setup_blocked_signals(struct sigaction *signal_action, int flags) {
	signal_action->sa_handler = SIG_DFL;

	// Block SIGUSR1 ?
	if (flags & BLOCK_USR1) {
		sigaddset(&signal_action->sa_mask, SIGUSR1);
	}

	// Block SIGUSR2 ?
	if (flags & BLOCK_USR2) {
		sigaddset(&signal_action->sa_mask, SIGUSR2);
	}

	// Change signal mask
	sigprocmask(SIG_BLOCK, &signal_action->sa_mask, NULL);
}